

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExceptionObjects.cpp
# Opt level: O2

ptr<Value> ExceptionObjects::simple_exception(string *type,string *message)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ptr<Value> pVar1;
  allocator<char> local_a9;
  undefined1 local_a8 [16];
  Identifier local_98;
  ptr<Value> local_78;
  ptr<Value> local_68;
  ObjectBuilder builder;
  
  builder.members.symbols._M_h._M_buckets = &builder.members.symbols._M_h._M_single_bucket;
  builder.members.symbols._M_h._M_bucket_count = 1;
  builder.members.symbols._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  builder.members.symbols._M_h._M_element_count = 0;
  builder.members.symbols._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  builder.members.symbols._M_h._M_rehash_policy._M_next_resize = 0;
  builder.members.symbols._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)(local_a8 + 0x10),"type",&local_a9);
  std::make_shared<String,std::__cxx11::string_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
  local_68.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_a8._0_8_;
  local_68.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_;
  local_a8._0_8_ = (pointer)0x0;
  local_a8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ObjectBuilder::putAttribute(&builder,(Identifier *)(local_a8 + 0x10),true,&local_68,Public);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_68.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 8));
  std::__cxx11::string::~string((string *)(local_a8 + 0x10));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_a8 + 0x10),"message",&local_a9);
  std::make_shared<String,std::__cxx11::string_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
  local_78.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_a8._0_8_;
  local_78.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_;
  local_a8._0_8_ = (pointer)0x0;
  local_a8._8_8_ = 0;
  ObjectBuilder::putAttribute(&builder,(Identifier *)(local_a8 + 0x10),true,&local_78,Public);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_78.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 8));
  std::__cxx11::string::~string((string *)(local_a8 + 0x10));
  ObjectBuilder::build((ObjectBuilder *)type);
  std::
  _Hashtable<Symbol,_std::pair<const_Symbol,_std::shared_ptr<Member>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Member>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_SymbolHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<Symbol,_std::pair<const_Symbol,_std::shared_ptr<Member>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Member>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_SymbolHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&builder);
  pVar1.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi
  ;
  pVar1.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)type;
  return (ptr<Value>)pVar1.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Value> ExceptionObjects::simple_exception(const std::string &type, const std::string &message) {
    ObjectBuilder builder;
    builder.putAttribute("type", true, make<String>(type));
    builder.putAttribute("message", true, make<String>(message));
    return builder.build();
}